

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O3

Mat * __thiscall
ncnn::Mat::reshape(Mat *__return_storage_ptr__,Mat *this,int _w,Allocator *_allocator)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  
  iVar6 = this->w;
  iVar1 = this->h;
  iVar2 = this->c;
  if (iVar1 * iVar6 * iVar2 == _w) {
    iVar3 = this->dims;
    sVar4 = this->cstep;
    if ((iVar3 == 3) && (sVar4 != (long)iVar1 * (long)iVar6)) {
      *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
      __return_storage_ptr__->data = (void *)0x0;
      __return_storage_ptr__->refcount = (int *)0x0;
      __return_storage_ptr__->allocator = (Allocator *)0x0;
      __return_storage_ptr__->dims = 0;
      __return_storage_ptr__->w = 0;
      __return_storage_ptr__->h = 0;
      __return_storage_ptr__->c = 0;
      __return_storage_ptr__->cstep = 0;
      create(__return_storage_ptr__,_w,this->elemsize,this->packing,_allocator);
      if (0 < this->c) {
        lVar7 = 0;
        do {
          sVar4 = this->elemsize;
          iVar6 = this->h * this->w;
          memcpy((void *)((long)((int)lVar7 * iVar6) * sVar4 + (long)__return_storage_ptr__->data),
                 (void *)(this->cstep * lVar7 * sVar4 + (long)this->data),(long)iVar6 * sVar4);
          lVar7 = lVar7 + 1;
        } while (lVar7 < this->c);
      }
    }
    else {
      __return_storage_ptr__->data = this->data;
      piVar5 = this->refcount;
      __return_storage_ptr__->refcount = piVar5;
      __return_storage_ptr__->elemsize = this->elemsize;
      __return_storage_ptr__->packing = this->packing;
      __return_storage_ptr__->allocator = this->allocator;
      __return_storage_ptr__->dims = iVar3;
      __return_storage_ptr__->w = iVar6;
      __return_storage_ptr__->h = iVar1;
      __return_storage_ptr__->c = iVar2;
      __return_storage_ptr__->cstep = sVar4;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      __return_storage_ptr__->dims = 1;
      __return_storage_ptr__->w = _w;
      __return_storage_ptr__->h = 1;
      __return_storage_ptr__->c = 1;
      __return_storage_ptr__->cstep = (long)_w;
    }
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
    __return_storage_ptr__->data = (void *)0x0;
    __return_storage_ptr__->refcount = (int *)0x0;
    __return_storage_ptr__->allocator = (Allocator *)0x0;
    __return_storage_ptr__->dims = 0;
    __return_storage_ptr__->w = 0;
    __return_storage_ptr__->h = 0;
    __return_storage_ptr__->c = 0;
    __return_storage_ptr__->cstep = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::reshape(int _w, Allocator* _allocator) const
{
    if (w * h * c != _w)
        return Mat();

    if (dims == 3 && cstep != (size_t)w * h)
    {
        Mat m;
        m.create(_w, elemsize, packing, _allocator);

        // flatten
        for (int i=0; i<c; i++)
        {
            const void* ptr = (unsigned char*)data + i * cstep * elemsize;
            void* mptr = (unsigned char*)m.data + i * w * h * elemsize;
            memcpy(mptr, ptr, w * h * elemsize);
        }

        return m;
    }

    Mat m = *this;

    m.dims = 1;
    m.w = _w;
    m.h = 1;
    m.c = 1;

    m.cstep = _w;

    return m;
}